

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::verifyTextureData
          (SparseTextureCommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  pointer *ppuVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  GLenum GVar5;
  ostream *poVar6;
  TestError *this_00;
  uchar *puVar7;
  uchar *puVar8;
  size_type sVar9;
  GLenum *pGVar10;
  GLubyte *outDataRegion_1;
  GLubyte *dataRegion_1;
  int local_160;
  int pixelSize_1;
  GLint z_1;
  GLint y_1;
  GLint x_1;
  GLint subTarget;
  size_t i;
  GLubyte *out_data_1;
  GLubyte *exp_data_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData_1;
  value_type_conflict1 local_100;
  GLint texSize_1;
  value_type_conflict1 local_f8 [4];
  undefined1 local_e8 [8];
  vector<int,_std::allocator<int>_> subTargets;
  GLubyte *outDataRegion;
  GLubyte *dataRegion;
  int pixelSize;
  GLint z;
  GLint y;
  GLint x;
  GLubyte *out_data;
  GLubyte *exp_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  GLint texSize;
  int iStack_60;
  bool result;
  GLint widthCommitted;
  GLint depth;
  GLint height;
  GLint width;
  TransferFormat local_4c;
  TransferFormat transferFormat;
  GLint level_local;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTextureCommitmentTestCase *this_local;
  
  poVar6 = std::operator<<((ostream *)&this->field_0x88,"Verify Texture [level: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,level);
  std::operator<<(poVar6,"] - ");
  if ((this->mState).levels + -1 < level) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
               ,0x7c5);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  _height = (this->mState).format;
  local_4c = glu::getTransferFormat(_height);
  SparseTextureUtils::getTextureLevelSize
            (target,&this->mState,level,&depth,&widthCommitted,&stack0xffffffffffffffa0);
  iVar2 = depth / 2;
  if (((iVar2 == 0) || (widthCommitted == 0)) || (iStack_60 < (this->mState).minDepth)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = true;
    if (target == 0x8513) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_e8);
      local_f8[3] = 0x8515;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_e8,local_f8 + 3);
      local_f8[2] = 0x8516;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_e8,local_f8 + 2);
      local_f8[1] = 0x8517;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_e8,local_f8 + 1);
      local_f8[0] = 0x8518;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_e8,local_f8);
      texSize_1 = 0x8519;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_e8,&texSize_1);
      local_100 = 0x851a;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_e8,&local_100);
      iVar3 = depth * widthCommitted;
      iVar4 = tcu::TextureFormat::getPixelSize(&(this->mState).format);
      iVar3 = iVar3 * iVar4;
      ppuVar1 = &vecOutData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data_1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,(long)iVar3);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data_1,(long)iVar3);
      puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &vecOutData_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data_1);
      ::deMemset(puVar7,level * 0x10 + 0x10,(long)iVar3);
      ::deMemset(puVar8,0xff,(long)iVar3);
      for (_x_1 = 0;
          sVar9 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_e8), _x_1 < sVar9;
          _x_1 = _x_1 + 1) {
        pGVar10 = (GLenum *)
                  std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_e8,_x_1);
        GVar5 = *pGVar10;
        poVar6 = std::operator<<((ostream *)&this->field_0x88,"Verify Subtarget [subtarget: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,GVar5);
        std::operator<<(poVar6,"] - ");
        ::deMemset(puVar8,0xff,(long)iVar3);
        gl4cts::Texture::GetData(gl,level,GVar5,local_4c.format,local_4c.dataType,puVar8);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"Texture::GetData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                        ,0x813);
        for (z_1 = 0; z_1 < iVar2; z_1 = z_1 + 1) {
          for (pixelSize_1 = 0; pixelSize_1 < widthCommitted; pixelSize_1 = pixelSize_1 + 1) {
            for (local_160 = 0; local_160 < iStack_60; local_160 = local_160 + 1) {
              iVar4 = tcu::TextureFormat::getPixelSize(&(this->mState).format);
              iVar4 = deMemCmp(puVar7 + (z_1 + pixelSize_1 * depth) * iVar4,
                               puVar8 + (z_1 + pixelSize_1 * depth) * iVar4,(long)iVar4);
              if (iVar4 != 0) {
                this_local._7_1_ = false;
              }
            }
          }
        }
        if (this_local._7_1_ == false) break;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data_1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &vecOutData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e8)
      ;
    }
    else {
      iVar3 = depth * widthCommitted * iStack_60;
      iVar4 = tcu::TextureFormat::getPixelSize(&(this->mState).format);
      iVar3 = iVar3 * iVar4;
      ppuVar1 = &vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,(long)iVar3);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data,(long)iVar3);
      puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &vecOutData.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      ::deMemset(puVar7,level * 0x10 + 0x10,(long)iVar3);
      ::deMemset(puVar8,0xff,(long)iVar3);
      gl4cts::Texture::GetData(gl,level,target,local_4c.format,local_4c.dataType,puVar8);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"Texture::GetData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x7e5);
      for (z = 0; z < iVar2; z = z + 1) {
        for (pixelSize = 0; pixelSize < widthCommitted; pixelSize = pixelSize + 1) {
          for (dataRegion._4_4_ = 0; dataRegion._4_4_ < iStack_60;
              dataRegion._4_4_ = dataRegion._4_4_ + 1) {
            iVar4 = tcu::TextureFormat::getPixelSize(&(this->mState).format);
            subTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage = (pointer)(puVar8 + (z + pixelSize * depth) * iVar4);
            iVar4 = deMemCmp(puVar7 + (z + pixelSize * depth) * iVar4,
                             subTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)iVar4);
            if (iVar4 != 0) {
              this_local._7_1_ = false;
            }
          }
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SparseTextureCommitmentTestCase::verifyTextureData(const Functions& gl, GLint target, GLint format,
														GLuint& texture, GLint level)
{
	DE_UNREF(format);
	DE_UNREF(texture);

	mLog << "Verify Texture [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	TransferFormat transferFormat = glu::getTransferFormat(mState.format);

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	if (target != GL_TEXTURE_CUBE_MAP)
	{
		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		deMemset(exp_data, 16 + 16 * level, texSize);
		deMemset(out_data, 255, texSize);

		Texture::GetData(gl, level, target, transferFormat.format, transferFormat.dataType, (GLvoid*)out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

		//Verify only committed region
		for (GLint x = 0; x < widthCommitted; ++x)
			for (GLint y = 0; y < height; ++y)
				for (GLint z = 0; z < depth; ++z)
				{
					int		 pixelSize	 = mState.format.getPixelSize();
					GLubyte* dataRegion	= exp_data + ((x + y * width) * pixelSize);
					GLubyte* outDataRegion = out_data + ((x + y * width) * pixelSize);
					if (deMemCmp(dataRegion, outDataRegion, pixelSize) != 0)
						result = false;
				}
	}
	else
	{
		std::vector<GLint> subTargets;

		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_X);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_X);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_Y);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_Z);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z);

		GLint texSize = width * height * mState.format.getPixelSize();

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		deMemset(exp_data, 16 + 16 * level, texSize);
		deMemset(out_data, 255, texSize);

		for (size_t i = 0; i < subTargets.size(); ++i)
		{
			GLint subTarget = subTargets[i];

			mLog << "Verify Subtarget [subtarget: " << subTarget << "] - ";

			deMemset(out_data, 255, texSize);

			Texture::GetData(gl, level, subTarget, transferFormat.format, transferFormat.dataType, (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

			//Verify only committed region
			for (GLint x = 0; x < widthCommitted; ++x)
				for (GLint y = 0; y < height; ++y)
					for (GLint z = 0; z < depth; ++z)
					{
						int		 pixelSize	 = mState.format.getPixelSize();
						GLubyte* dataRegion	= exp_data + ((x + y * width) * pixelSize);
						GLubyte* outDataRegion = out_data + ((x + y * width) * pixelSize);
						if (deMemCmp(dataRegion, outDataRegion, pixelSize) != 0)
							result = false;
					}

			if (!result)
				break;
		}
	}

	return result;
}